

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O0

void __thiscall
wasm::SmallVector<wasm::Literal,_1UL>::SmallVector
          (SmallVector<wasm::Literal,_1UL> *this,initializer_list<wasm::Literal> init)

{
  undefined1 local_50 [8];
  Literal item;
  const_iterator __end0;
  const_iterator __begin0;
  initializer_list<wasm::Literal> *__range2;
  SmallVector<wasm::Literal,_1UL> *this_local;
  initializer_list<wasm::Literal> init_local;
  
  init_local._M_array = (iterator)init._M_len;
  this_local = (SmallVector<wasm::Literal,_1UL> *)init._M_array;
  this->usedFixed = 0;
  std::array<wasm::Literal,_1UL>::array(&this->fixed);
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::vector(&this->flexible);
  __end0 = std::initializer_list<wasm::Literal>::begin
                     ((initializer_list<wasm::Literal> *)&this_local);
  item.type.id = (uintptr_t)
                 std::initializer_list<wasm::Literal>::end
                           ((initializer_list<wasm::Literal> *)&this_local);
  for (; __end0 != (const_iterator)item.type.id; __end0 = __end0 + 1) {
    wasm::Literal::Literal((Literal *)local_50,__end0);
    push_back(this,(Literal *)local_50);
    wasm::Literal::~Literal((Literal *)local_50);
  }
  return;
}

Assistant:

SmallVector(std::initializer_list<T> init) {
    for (T item : init) {
      push_back(item);
    }
  }